

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::divalpha(void *data,int npixels,DataType dt,int nchannels,int alphachan)

{
  int in_ECX;
  DataType in_EDX;
  int in_ESI;
  float *in_RDI;
  int in_R8D;
  float scale_00;
  float unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  float scale;
  
  scale_00 = OneValue(in_EDX);
  switch(in_EDX) {
  case dt_uint8:
    anon_unknown_1::divalpha<unsigned_char>((uchar *)in_RDI,in_ESI,in_ECX,in_R8D,scale_00);
    break;
  case dt_uint16:
    anon_unknown_1::divalpha<unsigned_short>((unsigned_short *)in_RDI,in_ESI,in_ECX,in_R8D,scale_00)
    ;
    break;
  case dt_half:
    anon_unknown_1::divalpha<Ptex::v2_4::PtexHalf>
              ((PtexHalf *)CONCAT44(nchannels,alphachan),(int)scale,in_stack_00000008,
               unaff_retaddr_00,unaff_retaddr);
    break;
  case dt_float:
    anon_unknown_1::divalpha<float>(in_RDI,in_ESI,in_ECX,in_R8D,scale_00);
  }
  return;
}

Assistant:

void divalpha(void* data, int npixels, DataType dt, int nchannels, int alphachan)
{
    float scale = OneValue(dt);
    switch(dt) {
    case dt_uint8:    divalpha(static_cast<uint8_t*>(data), npixels, nchannels, alphachan, scale); break;
    case dt_uint16:   divalpha(static_cast<uint16_t*>(data), npixels, nchannels, alphachan, scale); break;
    case dt_half:     divalpha(static_cast<PtexHalf*>(data), npixels, nchannels, alphachan, scale); break;
    case dt_float:    divalpha(static_cast<float*>(data), npixels, nchannels, alphachan, scale); break;
    }
}